

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,char *type,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  pointer *ppcVar1;
  NetPrivate *pNVar2;
  iterator __position;
  pointer pcVar3;
  int iVar4;
  int iVar5;
  custom_layer_registry_entry entry;
  custom_layer_registry_entry local_50;
  
  iVar4 = layer_to_index(type);
  if (iVar4 == -1) {
    iVar5 = (*this->_vptr_Net[2])(this,type);
    if (iVar5 == -1) {
      pNVar2 = this->d;
      __position._M_current =
           (pNVar2->custom_layer_registry).
           super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pNVar2->custom_layer_registry).
          super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_50.name = type;
        local_50.creator = creator;
        local_50.destroyer = destroyer;
        local_50.userdata = userdata;
        std::
        vector<ncnn::custom_layer_registry_entry,std::allocator<ncnn::custom_layer_registry_entry>>
        ::_M_realloc_insert<ncnn::custom_layer_registry_entry_const&>
                  ((vector<ncnn::custom_layer_registry_entry,std::allocator<ncnn::custom_layer_registry_entry>>
                    *)&pNVar2->custom_layer_registry,__position,&local_50);
      }
      else {
        (__position._M_current)->destroyer = destroyer;
        (__position._M_current)->userdata = userdata;
        (__position._M_current)->name = type;
        (__position._M_current)->creator = creator;
        ppcVar1 = &(pNVar2->custom_layer_registry).
                   super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
      }
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      fprintf(_stderr,"overwrite existing custom layer type %s",type);
      fputc(10,_stderr);
      pcVar3 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar3[iVar5].name = type;
      pcVar3[iVar5].creator = creator;
      pcVar3[iVar5].destroyer = destroyer;
      pcVar3[iVar5].userdata = userdata;
    }
  }
  else {
    register_custom_layer((Net *)type);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

int Net::register_custom_layer(const char* type, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int typeindex = layer_to_index(type);
    if (typeindex != -1)
    {
        NCNN_LOGE("can not register build-in layer type %s", type);
        return -1;
    }

    int custom_index = custom_layer_to_index(type);
    if (custom_index == -1)
    {
        struct custom_layer_registry_entry entry = {type, creator, destroyer, userdata};
        d->custom_layer_registry.push_back(entry);
    }
    else
    {
        NCNN_LOGE("overwrite existing custom layer type %s", type);
        d->custom_layer_registry[custom_index].name = type;
        d->custom_layer_registry[custom_index].creator = creator;
        d->custom_layer_registry[custom_index].destroyer = destroyer;
        d->custom_layer_registry[custom_index].userdata = userdata;
    }

    return 0;
}